

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

void dxil_spv_converter_add_local_root_descriptor_table
               (dxil_spv_converter converter,dxil_spv_resource_class resource_class,
               uint register_space,uint register_index,uint num_descriptors_in_range,
               uint offset_in_heap)

{
  initializer_list<dxil_spv::DescriptorTableEntry> __l;
  uint *this;
  DescriptorTableEntry local_94;
  iterator local_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  LocalRootParameter param;
  DescriptorTableEntry entry;
  uint offset_in_heap_local;
  uint num_descriptors_in_range_local;
  uint register_index_local;
  uint register_space_local;
  dxil_spv_resource_class resource_class_local;
  dxil_spv_converter converter_local;
  
  memset(&param.table_entries.
          super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x14);
  param.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = resource_class;
  param.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = register_space;
  if ((converter->active_table & 1U) == 0) {
    local_70._0_4_ = Constants;
    local_70._4_4_ = 0;
    param.type = Constants;
    param.local_constants.register_space = 0;
    param.local_constants.register_index = 0;
    param.local_constants.num_words = 0;
    param.local_descriptor.resource_class = SRV;
    this = &param.local_descriptor.register_index;
    memset(this,0,0x18);
    std::
    vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
    ::vector((vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
              *)this);
    local_70._0_4_ = Table;
    local_94.register_space =
         param.table_entries.
         super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_94.type =
         (ResourceClass)
         param.table_entries.
         super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_94.num_descriptors_in_range = num_descriptors_in_range;
    local_94.register_index = register_index;
    local_80 = &local_94;
    local_78 = 1;
    __l._M_len = 1;
    __l._M_array = local_80;
    local_94.offset_in_heap = offset_in_heap;
    std::
    vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
    ::operator=((vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                 *)&param.local_descriptor.register_index,__l);
    std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>::push_back
              (&converter->local_root_parameters,(value_type *)local_70);
    LocalRootParameter::~LocalRootParameter((LocalRootParameter *)local_70);
  }
  else {
    std::
    vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
    ::push_back(&converter->local_entries,
                (value_type *)
                &param.table_entries.
                 super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void dxil_spv_converter_add_local_root_descriptor_table(dxil_spv_converter converter,
                                                        dxil_spv_resource_class resource_class,
                                                        unsigned register_space,
                                                        unsigned register_index,
                                                        unsigned num_descriptors_in_range,
                                                        unsigned offset_in_heap)
{
	DescriptorTableEntry entry = {};
	entry.type = ResourceClass(resource_class);
	entry.register_space = register_space;
	entry.register_index = register_index;
	entry.num_descriptors_in_range = num_descriptors_in_range;
	entry.offset_in_heap = offset_in_heap;

	if (converter->active_table)
		converter->local_entries.push_back(entry);
	else
	{
		LocalRootParameter param = {};
		param.type = LocalRootParameterType::Table;
		param.table_entries = { entry };
		converter->local_root_parameters.push_back(std::move(param));
	}
}